

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::setup_tightenBound(HModel *this)

{
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  uint uVar11;
  pointer pdVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  int k;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  bool bVar22;
  bool bVar23;
  ulong uVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  vector<double,_std::allocator<double>_> ARvalue;
  vector<int,_std::allocator<int>_> ARindex;
  vector<int,_std::allocator<int>_> ARstart;
  vector<int,_std::allocator<int>_> iwork;
  vector<double,_std::allocator<double>_> colLower0;
  vector<double,_std::allocator<double>_> colUpper0;
  vector<double,_std::allocator<double>_> local_d8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  HModel *local_78;
  pointer local_70;
  pointer local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  if (this->intOption[3] != 0) {
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_90,(long)this->numRow,(value_type *)&local_a8,(allocator_type *)&local_c0);
    local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_a8,(long)this->numRow + 1,(value_type *)&local_c0,(allocator_type *)&local_d8)
    ;
    uVar17 = (uint)((ulong)((long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_c0,(long)(int)uVar17,(allocator_type *)&local_d8);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_d8,(long)(int)uVar17,(allocator_type *)&local_60);
    if (0 < (int)uVar17) {
      piVar5 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = 0;
      do {
        local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[piVar5[uVar16]] =
             local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[piVar5[uVar16]] + 1;
        uVar16 = uVar16 + 1;
      } while ((uVar17 & 0x7fffffff) != uVar16);
    }
    if (0 < this->numRow) {
      iVar14 = *(int *)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
      lVar18 = 0;
      do {
        iVar14 = iVar14 + local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar18];
        ((int *)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_))[lVar18 + 1] = iVar14;
        lVar18 = lVar18 + 1;
      } while (lVar18 < this->numRow);
    }
    if (0 < this->numRow) {
      lVar18 = 0;
      do {
        local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar18] =
             *(int *)(CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._0_4_) + lVar18 * 4);
        lVar18 = lVar18 + 1;
      } while (lVar18 < this->numRow);
    }
    if (0 < this->numCol) {
      piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar18 = 0;
      do {
        lVar20 = (long)piVar5[lVar18];
        lVar19 = lVar18 + 1;
        if (piVar5[lVar18] < piVar5[lVar18 + 1]) {
          do {
            iVar14 = piVar6[lVar20];
            iVar2 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar14];
            local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar14] = iVar2 + 1;
            *(int *)(CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + (long)iVar2 * 4) =
                 (int)lVar18;
            local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2] = pdVar7[lVar20];
            lVar20 = lVar20 + 1;
          } while (lVar20 < piVar5[lVar19]);
        }
        lVar18 = lVar19;
      } while (lVar19 < this->numCol);
    }
    __x = &this->colLower;
    std::vector<double,_std::allocator<double>_>::vector(&local_60,__x);
    __x_00 = &this->colUpper;
    std::vector<double,_std::allocator<double>_>::vector(&local_48,__x_00);
    uVar17 = this->numRow;
    local_68 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      iVar14 = 0;
      bVar23 = false;
      if (0 < (int)uVar17) {
        pdVar7 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_70 = (pointer)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_);
        pdVar8 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar16 = 0;
        do {
          dVar33 = local_68[uVar16];
          if ((-10000000000.0 <= dVar33) || (pdVar7[uVar16] <= 10000000000.0)) {
            iVar2 = *(int *)((long)local_70 + uVar16 * 4);
            lVar18 = (long)iVar2;
            iVar3 = *(int *)((long)local_70 + uVar16 * 4 + 4);
            if (iVar2 < iVar3) {
              pdVar12 = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar10 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              dVar26 = 0.0;
              dVar28 = 0.0;
              iVar15 = 0;
              iVar21 = 0;
              lVar19 = lVar18;
              do {
                iVar4 = *(int *)(CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                                          local_c0.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                lVar19 * 4);
                dVar32 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar19];
                if (dVar32 <= 0.0) {
                  dVar35 = -pdVar12[iVar4];
                  dVar31 = -pdVar10[iVar4];
                }
                else {
                  dVar35 = pdVar10[iVar4];
                  dVar31 = pdVar12[iVar4];
                }
                uVar24 = -(ulong)(10000000000.0 <= dVar35);
                uVar25 = -(ulong)(dVar31 <= -10000000000.0);
                iVar15 = iVar15 - (int)uVar24;
                dVar26 = (double)(~uVar24 & (ulong)(ABS(dVar32) * dVar35 + dVar26) |
                                 (ulong)dVar26 & uVar24);
                dVar28 = (double)(~uVar25 & (ulong)(ABS(dVar32) * dVar31 + dVar28) |
                                 (ulong)dVar28 & uVar25);
                iVar21 = iVar21 - (int)uVar25;
                lVar19 = lVar19 + 1;
              } while (iVar3 != lVar19);
            }
            else {
              dVar26 = 0.0;
              dVar28 = 0.0;
              iVar21 = 0;
              iVar15 = 0;
              pdVar12 = local_70;
            }
            dVar26 = ABS(dVar26) * 1e-08 + dVar26;
            dVar28 = ABS(dVar28) * -1e-08 + dVar28;
            auVar30._8_8_ = -(ulong)(100000000.0 < ABS(dVar28));
            auVar30._0_8_ = -(ulong)(100000000.0 < ABS(dVar26));
            uVar11 = movmskpd((int)pdVar12,auVar30);
            dVar32 = 0.0;
            if ((uVar11 & 2) == 0) {
              dVar35 = 0.0;
            }
            else {
              dVar35 = ABS(dVar28) * 1e-12;
            }
            if ((uVar11 & 1) != 0) {
              dVar32 = ABS(dVar26) * 1e-12;
            }
            dVar31 = pdVar7[uVar16];
            if (((dVar31 + 1e-07 < (double)iVar15 * 1e+31 + dVar26) ||
                ((double)iVar21 * -1e+31 + dVar28 < dVar33 + -1e-07)) && (iVar2 < iVar3)) {
              do {
                dVar27 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar18];
                iVar2 = *(int *)(CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                                          local_c0.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                lVar18 * 4);
                dVar1 = pdVar8[iVar2];
                dVar36 = pdVar9[iVar2];
                if (dVar27 <= 0.0) {
                  dVar29 = (double)(1 - iVar15) * dVar1 + (dVar33 - dVar26) / dVar27 + dVar32;
                  if (iVar15 != 0) {
                    dVar29 = (double)((ulong)dVar29 & -(ulong)(dVar1 < -10000000000.0) |
                                     ~-(ulong)(dVar1 < -10000000000.0) & 0x6974e718d7d7625a);
                  }
                  if (1 < iVar15 || dVar33 <= -10000000000.0) {
                    dVar29 = 1e+200;
                  }
                  if (iVar21 != 0 && dVar36 <= 10000000000.0 ||
                      (1 < iVar21 || 10000000000.0 <= dVar31)) {
                    dVar34 = -1e+200;
                  }
                  else {
                    dVar34 = ((double)(1 - iVar21) * dVar36 + (dVar31 - dVar28) / dVar27) - dVar35;
                  }
                }
                else {
                  dVar34 = ((double)(1 - iVar15) * dVar36 + (dVar33 - dVar26) / dVar27) - dVar32;
                  if (iVar15 != 0) {
                    dVar34 = (double)((ulong)dVar34 & -(ulong)(10000000000.0 < dVar36) |
                                     ~-(ulong)(10000000000.0 < dVar36) & 0xe974e718d7d7625a);
                  }
                  if (1 < iVar15 || dVar33 <= -10000000000.0) {
                    dVar34 = -1e+200;
                  }
                  if (iVar21 != 0 && -10000000000.0 <= dVar1 ||
                      (1 < iVar21 || 10000000000.0 <= dVar31)) {
                    dVar29 = 1e+200;
                  }
                  else {
                    dVar29 = (double)(1 - iVar21) * dVar1 + (dVar31 - dVar28) / dVar27 + dVar35;
                  }
                }
                if ((dVar29 < dVar36 + -1e-12) && (dVar29 < 10000000000.0)) {
                  dVar27 = dVar1;
                  if (dVar1 <= dVar29) {
                    dVar27 = dVar29;
                  }
                  pdVar9[iVar2] = dVar27;
                  iVar14 = iVar14 + 1;
                }
                if ((dVar1 + 1e-12 < dVar34) && (-10000000000.0 < dVar34)) {
                  if (dVar34 <= dVar36) {
                    dVar36 = dVar34;
                  }
                  pdVar8[iVar2] = dVar36;
                  iVar14 = iVar14 + 1;
                }
                lVar18 = lVar18 + 1;
              } while (lVar18 < iVar3);
            }
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar17);
        bVar23 = iVar14 != 0;
      }
    } while ((bVar23 != false) && (bVar22 = uVar13 < 10, uVar13 = bVar23 + uVar13, bVar22));
    iVar14 = this->numCol;
    if (0 < (long)iVar14) {
      pdVar7 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar18 = 0;
      do {
        dVar33 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar18];
        dVar26 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar18];
        if (dVar26 + 0.001 < dVar33) {
          dVar28 = pdVar7[lVar18];
          if (0.00100001 <= dVar28 - pdVar8[lVar18]) {
            if (dVar28 < dVar33) {
              if (dVar28 + 0.1 <= dVar33) {
                dVar33 = dVar28 + 0.1;
              }
              pdVar7[lVar18] = dVar33;
            }
            dVar33 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar18];
            if (dVar33 < pdVar8[lVar18]) {
              dVar26 = pdVar8[lVar18] + -0.1;
              if (dVar26 <= dVar33) {
                dVar33 = dVar26;
              }
              pdVar8[lVar18] = dVar33;
            }
          }
          else {
            dVar33 = pdVar8[lVar18] + -0.1;
            if (dVar33 <= dVar26) {
              dVar33 = dVar26;
            }
            pdVar8[lVar18] = dVar33;
            dVar33 = pdVar7[lVar18] + 0.1;
            if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar18] <= pdVar7[lVar18] + 0.1) {
              dVar33 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar18];
            }
            pdVar7[lVar18] = dVar33;
          }
        }
        lVar18 = lVar18 + 1;
      } while (iVar14 != lVar18);
    }
    local_78 = this;
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((void *)CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_c0.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    if ((void *)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HModel::setup_tightenBound() {
    if (intOption[INTOPT_TIGHT_FLAG] == 0)
        return;

    // Make a AR copy
    vector<int> iwork(numRow, 0);
    vector<int> ARstart(numRow + 1, 0);
    int AcountX = Aindex.size();
    vector<int> ARindex(AcountX);
    vector<double> ARvalue(AcountX);
    for (int k = 0; k < AcountX; k++)
        iwork[Aindex[k]]++;
    for (int i = 1; i <= numRow; i++)
        ARstart[i] = ARstart[i - 1] + iwork[i - 1];
    for (int i = 0; i < numRow; i++)
        iwork[i] = ARstart[i];
    for (int iCol = 0; iCol < numCol; iCol++) {
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
            int iRow = Aindex[k];
            int iPut = iwork[iRow]++;
            ARindex[iPut] = iCol;
            ARvalue[iPut] = Avalue[k];
        }
    }

    // Save column bounds
    vector<double> colLower0 = colLower;
    vector<double> colUpper0 = colUpper;

    double big_B = 1e10;
    int iPass = 0;
    for (;;) {
        int numberChanged = 0;
        for (int iRow = 0; iRow < numRow; iRow++) {
            // SKIP free rows
            if (rowLower[iRow] < -big_B && rowUpper[iRow] > big_B)
                continue;

            // possible row
            int ninfU = 0;
            int ninfL = 0;
            double xmaxU = 0.0;
            double xminL = 0.0;
            int myStart = ARstart[iRow];
            int myEnd = ARstart[iRow + 1];
            // Compute possible lower and upper ranges

            for (int k = myStart; k < myEnd; ++k) {
                int iCol = ARindex[k];
                double value = ARvalue[k];
                double upper = value > 0 ? colUpper[iCol] : -colLower[iCol];
                double lower = value > 0 ? colLower[iCol] : -colUpper[iCol];
                value = fabs(value);
                if (upper < big_B)
                    xmaxU += upper * value;
                else
                    ++ninfU;
                if (lower > -big_B)
                    xminL += lower * value;
                else
                    ++ninfL;
            }

            // Build in a margin of error
            xmaxU += 1.0e-8 * fabs(xmaxU);
            xminL -= 1.0e-8 * fabs(xminL);

            double xminLmargin =
                    (fabs(xminL) > 1.0e8) ? 1e-12 * fabs(xminL) : 0;
            double xmaxUmargin =
                    (fabs(xmaxU) > 1.0e8) ? 1e-12 * fabs(xmaxU) : 0;

            // Skip redundant row : also need to consider U < L  case
            double comp_U = xmaxU + ninfU * 1.0e31;
            double comp_L = xminL - ninfL * 1.0e31;
            if (comp_U <= rowUpper[iRow] + 1e-7
                    && comp_L >= rowLower[iRow] - 1e-7)
                continue;

            double row_L = rowLower[iRow];
            double row_U = rowUpper[iRow];

            // Now see if we can tighten column bounds
            for (int k = myStart; k < myEnd; ++k) {
                double value = ARvalue[k];
                int iCol = ARindex[k];
                double col_L = colLower[iCol];
                double col_U = colUpper[iCol];
                double new_L = -HSOL_CONST_INF;
                double new_U = +HSOL_CONST_INF;

                if (value > 0.0) {
                    if (row_L > -big_B && ninfU <= 1
                            && (ninfU == 0 || col_U > +big_B))
                        new_L = (row_L - xmaxU) / value + (1 - ninfU) * col_U
                                - xmaxUmargin;
                    if (row_U < +big_B && ninfL <= 1
                            && (ninfL == 0 || col_L < -big_B))
                        new_U = (row_U - xminL) / value + (1 - ninfL) * col_L
                                + xminLmargin;
                } else {
                    if (row_L > -big_B && ninfU <= 1
                            && (ninfU == 0 || col_L < -big_B))
                        new_U = (row_L - xmaxU) / value + (1 - ninfU) * col_L
                                + xmaxUmargin;
                    if (row_U < +big_B && ninfL <= 1
                            && (ninfL == 0 || col_U > +big_B))
                        new_L = (row_U - xminL) / value + (1 - ninfL) * col_U
                                - xminLmargin;
                }

                if (new_U < col_U - 1.0e-12 && new_U < big_B) {
                    colUpper[iCol] = max(new_U, col_L);
                    numberChanged++;
                }
                if (new_L > col_L + 1.0e-12 && new_L > -big_B) {
                    colLower[iCol] = min(new_L, col_U);
                    numberChanged++;
                }
            }
        }

        if (numberChanged == 0)
            break;
        iPass++;
        if (iPass > 10)
            break;

    }

    double useTolerance = 1.0e-3;
    for (int iCol = 0; iCol < numCol; iCol++) {
        if (colUpper0[iCol] > colLower0[iCol] + useTolerance) {
            const double relax = 100.0 * useTolerance;
            if (colUpper[iCol] - colLower[iCol] < useTolerance + 1.0e-8) {
                colLower[iCol] = max(colLower0[iCol], colLower[iCol] - relax);
                colUpper[iCol] = min(colUpper0[iCol], colUpper[iCol] + relax);
            } else {
                if (colUpper[iCol] < colUpper0[iCol]) {
                    colUpper[iCol] = min(colUpper[iCol] + relax,
                            colUpper0[iCol]);
                }
                if (colLower[iCol] > colLower0[iCol]) {
                    colLower[iCol] = min(colLower[iCol] - relax,
                            colLower0[iCol]);
                }
            }
        }
    }
}